

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O0

int sc_jsf(int *u0,int *u1,limb_t *a,limb_t *b)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  int k;
  int j;
  int i;
  limb_t n1;
  limb_t n0;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  
  local_30 = 0;
  local_28 = 0;
  local_3c = 0;
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    local_28 = *(long *)(in_RDX + (long)local_34 * 8) + local_28;
    local_30 = *(long *)(in_RCX + (long)local_34 * 8) + local_30;
    for (local_38 = 0; local_38 < 0x34; local_38 = local_38 + 1) {
      iVar1 = jsfdigit((uint)local_28,(uint)local_30);
      *(int *)(in_RDI + (long)local_3c * 4) = iVar1;
      iVar1 = jsfdigit((uint)local_30,(uint)local_28);
      *(int *)(in_RSI + (long)local_3c * 4) = iVar1;
      local_28 = local_28 - *(int *)(in_RDI + (long)local_3c * 4) >> 1;
      local_30 = local_30 - *(int *)(in_RSI + (long)local_3c * 4) >> 1;
      local_3c = local_3c + 1;
    }
  }
  iVar1 = jsfdigit((uint)local_28,(uint)local_30);
  *(int *)(in_RDI + (long)local_3c * 4) = iVar1;
  iVar1 = jsfdigit((uint)local_30,(uint)local_28);
  *(int *)(in_RSI + (long)local_3c * 4) = iVar1;
  while( true ) {
    bVar2 = false;
    if ((-1 < local_3c) && (bVar2 = false, *(int *)(in_RDI + (long)local_3c * 4) == 0)) {
      bVar2 = *(int *)(in_RSI + (long)local_3c * 4) == 0;
    }
    if (!bVar2) break;
    local_3c = local_3c + -1;
  }
  return local_3c;
}

Assistant:

int
sc_jsf(int u0[SC_BITS+1], int u1[SC_BITS+1], const sc_t a, const sc_t b)
{
	limb_t n0, n1;
	int i, j, k;

	k = n0 = n1 = 0;

	for (i = 0; i < K; i++) {
		n0 += a[i];
		n1 += b[i];

		for (j = 0; j < LB; j++, k++) {
			u0[k] = jsfdigit(n0, n1);
			u1[k] = jsfdigit(n1, n0);

			n0 = (n0 - u0[k]) >> 1;
			n1 = (n1 - u1[k]) >> 1;
		}
	}
	u0[k] = jsfdigit(n0, n1);
	u1[k] = jsfdigit(n1, n0);

	while (k >= 0 && u0[k] == 0 && u1[k] == 0)
		k--;

	return k;
}